

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkSurfaceTransformFlagBitsKHR
Diligent::SurfaceTransformToVkSurfaceTransformFlag(SURFACE_TRANSFORM SrfTransform)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  SURFACE_TRANSFORM SrfTransform_local;
  
  msg.field_2._8_4_ = SrfTransform;
  switch(SrfTransform) {
  case SURFACE_TRANSFORM_OPTIMAL:
    FormatString<char[58]>
              ((string *)local_30,
               (char (*) [58])"Optimal transform does not have corresponding Vulkan flag");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"SurfaceTransformToVkSurfaceTransformFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x601);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 1;
    break;
  case SURFACE_TRANSFORM_IDENTITY:
    msg.field_2._12_4_ = 1;
    break;
  case SURFACE_TRANSFORM_ROTATE_90:
    msg.field_2._12_4_ = 2;
    break;
  case SURFACE_TRANSFORM_ROTATE_180:
    msg.field_2._12_4_ = 4;
    break;
  case SURFACE_TRANSFORM_ROTATE_270:
    msg.field_2._12_4_ = 8;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR:
    msg.field_2._12_4_ = 0x10;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90:
    msg.field_2._12_4_ = 0x20;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180:
    msg.field_2._12_4_ = 0x40;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270:
    msg.field_2._12_4_ = 0x80;
    break;
  default:
    FormatString<char[29]>((string *)local_60,(char (*) [29])"Unexpected surface transform");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"SurfaceTransformToVkSurfaceTransformFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x60e);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 1;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkSurfaceTransformFlagBitsKHR SurfaceTransformToVkSurfaceTransformFlag(SURFACE_TRANSFORM SrfTransform)
{
    // clang-format off
    switch (SrfTransform)
    {
        case SURFACE_TRANSFORM_OPTIMAL:
            UNEXPECTED("Optimal transform does not have corresponding Vulkan flag");
            return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;

        case SURFACE_TRANSFORM_IDENTITY:                      return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_90:                     return VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_180:                    return VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_270:                    return VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR:             return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90:   return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180:  return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270:  return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;

        default:
            UNEXPECTED("Unexpected surface transform");
            return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    }
    // clang-format on
}